

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1gload.c
# Opt level: O0

FT_Error T1_Get_Advances(FT_Face t1face,FT_UInt first,FT_UInt count,FT_Int32 load_flags,
                        FT_Fixed *advances)

{
  FT_Error FVar1;
  FT_Fixed FVar2;
  uint local_c04;
  FT_Error error;
  FT_UInt nn;
  PSAux_Service psaux;
  T1_Font type1;
  T1_DecoderRec decoder;
  T1_Face face;
  FT_Fixed *advances_local;
  FT_Int32 load_flags_local;
  FT_UInt count_local;
  FT_UInt first_local;
  FT_Face t1face_local;
  
  if ((load_flags & 0x10U) == 0) {
    decoder.cf2_instance.finalizer = (FT_Generic_Finalizer)t1face;
    t1face_local._4_4_ =
         (*(code *)**(undefined8 **)(t1face[3].family_name + 0x18))
                   (&type1,t1face,0,0,t1face[2].glyph,t1face[3].bbox.xMin,0,0,T1_Parse_Glyph);
    if (t1face_local._4_4_ == 0) {
      decoder.builder.bbox.yMax._6_1_ = 1;
      decoder.builder.bbox.yMax._4_1_ = 0;
      decoder.glyph_names._4_4_ = (undefined4)t1face[2].bbox.yMin;
      decoder._2712_8_ = t1face[2].bbox.xMax;
      decoder.subrs = (FT_Byte **)t1face[2].bbox.yMax;
      decoder.subrs_len = *(FT_UInt **)&t1face[2].units_per_EM;
      decoder.funcs.parse_charstrings =
           *(_func_FT_Error_PS_Decoder_ptr_FT_Byte_ptr_FT_ULong **)
            (decoder.cf2_instance.finalizer + 0x368);
      decoder.buildchar._0_4_ = *(undefined4 *)(decoder.cf2_instance.finalizer + 0x360);
      for (local_c04 = 0; local_c04 < count; local_c04 = local_c04 + 1) {
        FVar1 = T1_Parse_Glyph((T1_Decoder_conflict)&type1,first + local_c04);
        if (FVar1 == 0) {
          FVar2 = FT_RoundFix(decoder.builder.left_bearing.y);
          advances[local_c04] = FVar2 >> 0x10;
        }
        else {
          advances[local_c04] = 0;
        }
      }
      t1face_local._4_4_ = 0;
    }
  }
  else {
    for (local_c04 = 0; local_c04 < count; local_c04 = local_c04 + 1) {
      advances[local_c04] = 0;
    }
    t1face_local._4_4_ = 0;
  }
  return t1face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Advances( FT_Face    t1face,        /* T1_Face */
                   FT_UInt    first,
                   FT_UInt    count,
                   FT_Int32   load_flags,
                   FT_Fixed*  advances )
  {
    T1_Face        face  = (T1_Face)t1face;
    T1_DecoderRec  decoder;
    T1_Font        type1 = &face->type1;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;
    FT_UInt        nn;
    FT_Error       error;


    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      for ( nn = 0; nn < count; nn++ )
        advances[nn] = 0;

      return FT_Err_Ok;
    }

    error = psaux->t1_decoder_funcs->init( &decoder,
                                           (FT_Face)face,
                                           0, /* size       */
                                           0, /* glyph slot */
                                           (FT_Byte**)type1->glyph_names,
                                           face->blend,
                                           0,
                                           FT_RENDER_MODE_NORMAL,
                                           T1_Parse_Glyph );
    if ( error )
      return error;

    decoder.builder.metrics_only = 1;
    decoder.builder.load_points  = 0;

    decoder.num_subrs  = type1->num_subrs;
    decoder.subrs      = type1->subrs;
    decoder.subrs_len  = type1->subrs_len;
    decoder.subrs_hash = type1->subrs_hash;

    decoder.buildchar     = face->buildchar;
    decoder.len_buildchar = face->len_buildchar;

    for ( nn = 0; nn < count; nn++ )
    {
      error = T1_Parse_Glyph( &decoder, first + nn );
      if ( !error )
        advances[nn] = FIXED_TO_INT( decoder.builder.advance.x );
      else
        advances[nn] = 0;
    }

    return FT_Err_Ok;
  }